

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void trigger_user_callback(pa_stream *s,void *input_data,size_t nbytes,cubeb_stream_conflict *stm)

{
  pa_context *ppVar1;
  _func_pa_time_event_ptr_pa_context_ptr_pa_usec_t_pa_time_event_cb_t_void_ptr *p_Var2;
  pa_usec_t pVar3;
  pa_time_event *ppVar4;
  long *in_RCX;
  ulong in_RDX;
  long in_RSI;
  pa_stream *in_RDI;
  pa_usec_t latency;
  uint32_t i_1;
  float *b_1;
  uint32_t i;
  short *b;
  uint32_t samples;
  size_t in_frame_size;
  size_t frame_size;
  size_t read_offset;
  size_t towrite;
  long got;
  int r;
  size_t size;
  void *buffer;
  pa_usec_t local_90;
  uint local_84;
  void *local_80;
  uint local_74;
  void *local_70;
  uint local_64;
  size_t local_60;
  size_t local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  ulong local_30;
  void *local_28;
  long *local_20;
  ulong local_18;
  long local_10;
  pa_stream *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_58 = (*cubeb_pa_frame_size)((pa_sample_spec *)(in_RCX + 7));
  local_48 = local_18;
  local_50 = 0;
  while( true ) {
    if (local_48 == 0) {
      return;
    }
    local_30 = local_48;
    local_34 = (*cubeb_pa_stream_begin_write)(local_8,&local_28,&local_30);
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (CUBEB_LOG_NORMAL < g_cubeb_log_level))
    {
      (*g_cubeb_log_callback)
                ("%s:%d: Trigger user callback with output buffer size=%zd, read_offset=%zd\n",
                 "cubeb_pulse.c",0x10f,local_30,local_50);
    }
    local_40 = (*(code *)local_20[4])
                         (local_20,local_20[1],local_10 + local_50,local_28,local_30 / local_58);
    if ((long)local_40 < 0) break;
    if (local_10 != 0) {
      local_60 = (*cubeb_pa_frame_size)((pa_sample_spec *)((long)local_20 + 0x44));
      local_50 = (local_30 / local_58) * local_60 + local_50;
    }
    if ((*(float *)((long)local_20 + 0x54) != -1.0) || (NAN(*(float *)((long)local_20 + 0x54)))) {
      local_64 = (uint)((local_30 * *(byte *)(local_20 + 8)) / local_58);
      if (((int)local_20[7] == 4) || ((int)local_20[7] == 3)) {
        local_70 = local_28;
        for (local_74 = 0; local_74 < local_64; local_74 = local_74 + 1) {
          *(short *)((long)local_28 + (ulong)local_74 * 2) =
               (short)(int)((float)(int)*(short *)((long)local_28 + (ulong)local_74 * 2) *
                           *(float *)((long)local_20 + 0x54));
        }
      }
      else {
        local_80 = local_28;
        for (local_84 = 0; local_84 < local_64; local_84 = local_84 + 1) {
          *(float *)((long)local_28 + (ulong)local_84 * 4) =
               *(float *)((long)local_20 + 0x54) * *(float *)((long)local_28 + (ulong)local_84 * 4);
        }
      }
    }
    local_34 = (*cubeb_pa_stream_write)
                         (local_8,local_28,local_40 * local_58,(pa_free_cb_t)0x0,0,PA_SEEK_RELATIVE)
    ;
    if (local_40 < local_30 / local_58) {
      local_90 = 0;
      local_34 = (*cubeb_pa_stream_get_latency)(local_8,&local_90,(int *)0x0);
      p_Var2 = cubeb_pa_context_rttime_new;
      if (local_34 == -0x10) {
        local_90 = 100000;
      }
      ppVar1 = *(pa_context **)(*local_20 + 0x18);
      pVar3 = (*cubeb_pa_rtclock_now)();
      ppVar4 = (*p_Var2)(ppVar1,pVar3 + local_90 * 2,stream_drain_callback,local_20);
      local_20[6] = (long)ppVar4;
      *(undefined4 *)(local_20 + 10) = 1;
      return;
    }
    local_48 = local_48 - local_30;
  }
  (*cubeb_pa_stream_cancel_write)(local_8);
  *(undefined4 *)(local_20 + 10) = 1;
  return;
}

Assistant:

static void
trigger_user_callback(pa_stream * s, void const * input_data, size_t nbytes, cubeb_stream * stm)
{
  void * buffer;
  size_t size;
  int r;
  long got;
  size_t towrite, read_offset;
  size_t frame_size;

  frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
  assert(nbytes % frame_size == 0);

  towrite = nbytes;
  read_offset = 0;
  while (towrite) {
    size = towrite;
    r = WRAP(pa_stream_begin_write)(s, &buffer, &size);
    // Note: this has failed running under rr on occassion - needs investigation.
    assert(r == 0);
    assert(size > 0);
    assert(size % frame_size == 0);

    LOGV("Trigger user callback with output buffer size=%zd, read_offset=%zd", size, read_offset);
    got = stm->data_callback(stm, stm->user_ptr, (uint8_t const *)input_data + read_offset, buffer, size / frame_size);
    if (got < 0) {
      WRAP(pa_stream_cancel_write)(s);
      stm->shutdown = 1;
      return;
    }
    // If more iterations move offset of read buffer
    if (input_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      read_offset += (size / frame_size) * in_frame_size;
    }

    if (stm->volume != PULSE_NO_GAIN) {
      uint32_t samples =  size * stm->output_sample_spec.channels / frame_size ;

      if (stm->output_sample_spec.format == PA_SAMPLE_S16BE ||
          stm->output_sample_spec.format == PA_SAMPLE_S16LE) {
        short * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      } else {
        float * b = buffer;
        for (uint32_t i = 0; i < samples; i++) {
          b[i] *= stm->volume;
        }
      }
    }

    r = WRAP(pa_stream_write)(s, buffer, got * frame_size, NULL, 0, PA_SEEK_RELATIVE);
    assert(r == 0);

    if ((size_t) got < size / frame_size) {
      pa_usec_t latency = 0;
      r = WRAP(pa_stream_get_latency)(s, &latency, NULL);
      if (r == -PA_ERR_NODATA) {
        /* this needs a better guess. */
        latency = 100 * PA_USEC_PER_MSEC;
      }
      assert(r == 0 || r == -PA_ERR_NODATA);
      /* pa_stream_drain is useless, see PA bug# 866. this is a workaround. */
      /* arbitrary safety margin: double the current latency. */
      assert(!stm->drain_timer);
      stm->drain_timer = WRAP(pa_context_rttime_new)(stm->context->context, WRAP(pa_rtclock_now)() + 2 * latency, stream_drain_callback, stm);
      stm->shutdown = 1;
      return;
    }

    towrite -= size;
  }

  assert(towrite == 0);
}